

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O0

la_ssize_t archive_write_data(archive *a,void *buff,size_t s)

{
  ssize_t sVar1;
  size_t s_local;
  void *buff_local;
  archive *a_local;
  
  sVar1 = (*a->vtable->archive_write_data)(a,buff,s);
  return sVar1;
}

Assistant:

static ssize_t
_archive_write_data(struct archive *_a, const void *buff, size_t s)
{
	struct archive_write *a = (struct archive_write *)_a;
	const size_t max_write = INT_MAX;

	archive_check_magic(&a->archive, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_DATA, "archive_write_data");
	/* In particular, this catches attempts to pass negative values. */
	if (s > max_write)
		s = max_write;
	archive_clear_error(&a->archive);
	return ((a->format_write_data)(a, buff, s));
}